

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O2

bool __thiscall
Js::PathTypeHandlerBase::CanStorePropertyValueDirectly
          (PathTypeHandlerBase *this,DynamicObject *instance,PropertyId propertyId,
          bool allowLetConst)

{
  TypePath *this_00;
  code *pcVar1;
  bool bVar2;
  PropertyIndex index;
  undefined4 *puVar3;
  undefined7 in_register_00000009;
  
  if ((int)CONCAT71(in_register_00000009,allowLetConst) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,2999,"(!allowLetConst)","!allowLetConst");
    if (!bVar2) goto LAB_00c4d778;
    *puVar3 = 0;
  }
  if (propertyId == -1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0xbba,"(propertyId != Constants::NoProperty)",
                                "propertyId != Constants::NoProperty");
    if (!bVar2) goto LAB_00c4d778;
    *puVar3 = 0;
  }
  index = GetPropertyIndex(this,propertyId);
  if (index == 0xffff) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0xbcb,"(false)",
                                "Asking about a property this type handler doesn\'t know about?");
    if (!bVar2) {
LAB_00c4d778:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  else {
    if (DAT_0145c381 != '\x01') {
      return true;
    }
    this_00 = (this->typePath).ptr;
    if (index < ((this_00->data).ptr)->maxInitializedLength) {
      bVar2 = TypePath::GetIsFixedFieldAt
                        (this_00,index,(uint)((this->super_DynamicTypeHandler).unusedBytes >> 1));
      return !bVar2;
    }
  }
  return false;
}

Assistant:

bool PathTypeHandlerBase::CanStorePropertyValueDirectly(const DynamicObject* instance, PropertyId propertyId, bool allowLetConst)
    {
        Assert(!allowLetConst);
        // We pass Constants::NoProperty for ActivationObjects for functions with same named formals, but we don't
        // use PathTypeHandlers for those.
        Assert(propertyId != Constants::NoProperty);
        Js::PropertyIndex index = GetPropertyIndex(propertyId);
        if (index != Constants::NoSlot)
        {
#ifdef SUPPORT_FIXED_FIELDS_ON_PATH_TYPES
            if (FixPropsOnPathTypes())
            {
                return index < this->GetTypePath()->GetMaxInitializedLength() && !this->GetTypePath()->GetIsFixedFieldAt(index, this->GetPathLength());
            }
            else
#endif
            {
                return true;
            }
        }
        else
        {
            AssertMsg(false, "Asking about a property this type handler doesn't know about?");
            return false;
        }
    }